

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O0

bool validate_any_path(char *path)

{
  char cVar1;
  bool local_1a;
  char last;
  char *path_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path_local._7_1_ = false;
  }
  else {
    cVar1 = get_last_char(path);
    local_1a = cVar1 != '/' && cVar1 != '\\';
    path_local._7_1_ = local_1a;
  }
  return path_local._7_1_;
}

Assistant:

static bool validate_any_path(const char *path)
{
  if (path == nullptr || *path == '\0')
  {
    return false;
  }

  // This also helps to validate that the string has a null terminator and
  // doesn't run off the end of memory.
  char last = get_last_char(path);
  return last != '/' && last != '\\';
}